

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

int __thiscall Potassco::Application::main(Application *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  __sighandler_t p_Var3;
  int __how;
  Application *in_RDI;
  int *sig;
  char **in_stack_00000268;
  int in_stack_00000274;
  Application *in_stack_00000278;
  uint in_stack_ffffffffffffffbc;
  uint7 in_stack_ffffffffffffffc0;
  int *local_20;
  
  initInstance(in_RDI,in_RDI);
  in_RDI->exitCode_ = 1;
  in_RDI->pending_ = 0;
  in_RDI->blocked_ = in_RDI->pending_;
  bVar1 = getOptions(in_stack_00000278,in_stack_00000274,in_stack_00000268);
  if (bVar1) {
    iVar2 = (*in_RDI->_vptr_Application[2])();
    local_20 = (int *)CONCAT44(extraout_var,iVar2);
    while( true ) {
      bVar1 = false;
      if (local_20 != (int *)0x0) {
        bVar1 = *local_20 != 0;
      }
      if (!bVar1) break;
      p_Var3 = signal(*local_20,sigHandler);
      if (p_Var3 == (__sighandler_t)0x1) {
        signal(*local_20,(__sighandler_t)0x1);
      }
      local_20 = local_20 + 1;
    }
    if ((in_RDI->timeout_ != 0) &&
       (iVar2 = setAlarm((Application *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc),
       iVar2 == 0)) {
      (*in_RDI->_vptr_Application[8])();
    }
    in_RDI->exitCode_ = 0;
    (*in_RDI->_vptr_Application[0xe])();
    (*in_RDI->_vptr_Application[0xf])();
    shutdown(in_RDI,0,__how);
  }
  if ((in_RDI->fastExit_ & 1U) != 0) {
    exit(in_RDI,in_RDI->exitCode_);
  }
  fflush(_stdout);
  fflush(_stderr);
  return in_RDI->exitCode_;
}

Assistant:

int Application::main(int argc, char** argv) {
	initInstance(*this); // singleton instance used for signal handling
	exitCode_ = EXIT_FAILURE;
	blocked_  = pending_ = 0;
	if (getOptions(argc, argv)) {
		// install signal handlers
		for (const int* sig = getSignals(); sig && *sig; ++sig) {
			if (signal(*sig, &Application::sigHandler) == SIG_IGN) {
				signal(*sig, SIG_IGN);
			}
		}
		if (timeout_) {
			if (setAlarm(timeout_) == 0) { warn("Could not set time limit!"); }
		}
		exitCode_ = EXIT_SUCCESS;
		try         { setup(); run(); shutdown(false); }
		catch (...) { shutdown(true); }
	}
	if (fastExit_) { exit(exitCode_); }
	fflush(stdout);
	fflush(stderr);
	return exitCode_;
}